

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

idx_t duckdb::BinaryExecutor::
      SelectFlat<unsigned_int,unsigned_int,duckdb::GreaterThanEquals,false,false>
                (Vector *left,Vector *right,SelectionVector *sel,idx_t count,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  uint *ldata;
  uint *rdata;
  idx_t iVar1;
  ValidityMask combined_mask;
  TemplatedValidityMask<unsigned_long> local_50;
  
  ldata = (uint *)left->data;
  rdata = (uint *)right->data;
  FlatVector::VerifyFlatVector(left);
  TemplatedValidityMask<unsigned_long>::TemplatedValidityMask
            (&local_50,&(left->validity).super_TemplatedValidityMask<unsigned_long>);
  FlatVector::VerifyFlatVector(right);
  ValidityMask::Combine((ValidityMask *)&local_50,&right->validity,count);
  iVar1 = SelectFlatLoopSwitch<unsigned_int,unsigned_int,duckdb::GreaterThanEquals,false,false>
                    (ldata,rdata,sel,count,(ValidityMask *)&local_50,true_sel,false_sel);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_50.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return iVar1;
}

Assistant:

static idx_t SelectFlat(Vector &left, Vector &right, const SelectionVector *sel, idx_t count,
	                        SelectionVector *true_sel, SelectionVector *false_sel) {
		auto ldata = FlatVector::GetData<LEFT_TYPE>(left);
		auto rdata = FlatVector::GetData<RIGHT_TYPE>(right);

		if (LEFT_CONSTANT && ConstantVector::IsNull(left)) {
			if (false_sel) {
				for (idx_t i = 0; i < count; i++) {
					false_sel->set_index(i, sel->get_index(i));
				}
			}
			return 0;
		}
		if (RIGHT_CONSTANT && ConstantVector::IsNull(right)) {
			if (false_sel) {
				for (idx_t i = 0; i < count; i++) {
					false_sel->set_index(i, sel->get_index(i));
				}
			}
			return 0;
		}

		if (LEFT_CONSTANT) {
			return SelectFlatLoopSwitch<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT>(
			    ldata, rdata, sel, count, FlatVector::Validity(right), true_sel, false_sel);
		} else if (RIGHT_CONSTANT) {
			return SelectFlatLoopSwitch<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT>(
			    ldata, rdata, sel, count, FlatVector::Validity(left), true_sel, false_sel);
		} else {
			ValidityMask combined_mask = FlatVector::Validity(left);
			combined_mask.Combine(FlatVector::Validity(right), count);
			return SelectFlatLoopSwitch<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT>(
			    ldata, rdata, sel, count, combined_mask, true_sel, false_sel);
		}
	}